

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::initNgrams(Dictionary *this)

{
  pointer peVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  subentry sl;
  subentry sm;
  subentry local_80;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [24];
  
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < (ulong)(long)this->size_; uVar4 = uVar4 + 1) {
    peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)((long)&(peVar1->subwords).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + lVar3);
    if (*(long *)((long)&(peVar1->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                 lVar3 + 8) != lVar2) {
      *(long *)((long)&(peVar1->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl +
               lVar3 + 8) = lVar2;
    }
    local_80.subword._M_dataplus._M_p._0_4_ = (int)uVar4;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(peVar1->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl +
               lVar3),(int *)&local_80);
    local_80.subword._M_dataplus._M_p = (pointer)&local_80.subword.field_2;
    local_80.subword._M_string_length = 0;
    local_80.subword.field_2._M_local_buf[0] = '\0';
    local_58 = local_48;
    local_50 = 0;
    local_48[0] = 0;
    subentry::operator=((subentry *)
                        ((long)&(((this->words_).
                                  super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->sublemma).subword.
                                _M_dataplus + lVar3),&local_80);
    peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    computeNgrams(this,(string *)((long)&(peVar1->actual_word)._M_dataplus._M_p + lVar3),
                  (vector<int,_std::allocator<int>_> *)
                  ((long)&(peVar1->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                  lVar3),(vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                         ((long)&(peVar1->subngram).
                                 super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>
                                 ._M_impl + lVar3),
                  (subentry *)((long)&(peVar1->sublemma).subword._M_dataplus + lVar3),
                  (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                  ((long)&(peVar1->submorph).
                          super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>
                          ._M_impl + lVar3),
                  (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                  ((long)&(peVar1->subipangram).
                          super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>
                          ._M_impl + lVar3));
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_80);
    lVar3 = lVar3 + 0xd8;
  }
  return;
}

Assistant:

void Dictionary::initNgrams() {
  for (size_t i = 0; i < size_; i++) {
  	 words_[i].subwords.clear();
 	 words_[i].subwords.push_back(i);
	 subentry sl;
	 subentry sm;
         words_[i].sublemma = sl;
   	 computeNgrams(words_[i].actual_word, words_[i].subwords, words_[i].subngram,words_[i].sublemma,words_[i].submorph,words_[i].subipangram);
  }
}